

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pager.cpp
# Opt level: O3

void pager::create(string *fileName)

{
  uchar *p;
  value_type_conflict3 *__val;
  r_file f;
  r_file rStack_38;
  long *local_30 [2];
  long local_20 [2];
  
  local_30[0] = local_20;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_30,"w+","");
  r_file::open(&rStack_38,(char *)fileName,(int)local_30);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  p = (uchar *)operator_new(0x1000);
  memset(p + 0xc,0,0xff4);
  p[0] = '\x01';
  p[1] = '\0';
  p[2] = '\0';
  p[3] = '\0';
  p[4] = '\0';
  p[5] = '\0';
  p[6] = '\0';
  p[7] = '\0';
  p[8] = '\0';
  p[9] = '\0';
  p[10] = '\0';
  p[0xb] = '\0';
  block_write_file<unsigned_char,r_file>(p,0x1000,&rStack_38,0x1000);
  operator_delete(p,0x1000);
  r_file::~r_file(&rStack_38);
  return;
}

Assistant:

void pager::create(const std::string& fileName)
{
    auto f = r_file::open(fileName, "w+");

    vector<uint8_t> block(pager::block_size());

    memset(&block[0], 0, pager::block_size());
    *(uint32_t*)&block[0] = 1;
    *(uint64_t*)&block[4] = 0;

    block_write_file(&block[0], pager::block_size(), f);
}